

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_tree_element_base
              (nk_context *ctx,nk_tree_type type,nk_image *img,char *title,
              nk_collapse_states initial_state,int *selected,char *hash,int len,int line)

{
  nk_style_selectable *style;
  int *piVar1;
  nk_window *pnVar2;
  nk_panel *pnVar3;
  nk_user_font *pnVar4;
  nk_rect r;
  nk_rect rect;
  char *str;
  undefined4 uVar5;
  nk_hash name;
  int iVar6;
  nk_widget_layout_states nVar7;
  int iVar8;
  nk_table *pnVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  nk_uint *unaff_R13;
  nk_context *in;
  nk_command_buffer *b;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  nk_rect rect_00;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect bounds_01;
  nk_rect header;
  nk_flags local_a4;
  nk_panel *local_a0;
  float local_98;
  float local_94;
  float local_90;
  nk_flags ws;
  int *local_88;
  char *local_80;
  undefined1 local_78 [16];
  nk_image *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_78._0_4_ = type;
  pnVar2 = ctx->current;
  local_80 = title;
  local_60 = img;
  if (hash == (char *)0x0) {
    len = nk_strlen(title);
    hash = title;
    unaff_R13 = (nk_uint *)title;
  }
  name = nk_murmur_hash(hash,len,line);
  pnVar9 = pnVar2->tables;
  do {
    if (pnVar9 == (nk_table *)0x0) {
      unaff_R13 = (nk_uint *)0x0;
      break;
    }
    uVar12 = (ulong)pnVar9->size;
    bVar15 = uVar12 != 0;
    if (uVar12 == 0) {
LAB_0011cc06:
      pnVar9 = pnVar9->next;
    }
    else {
      if (pnVar9->keys[0] == name) {
        bVar15 = true;
        uVar13 = 0;
      }
      else {
        uVar11 = 0;
        do {
          if (uVar12 - 1 == uVar11) {
            bVar15 = uVar11 + 1 < uVar12;
            goto LAB_0011cc06;
          }
          uVar13 = uVar11 + 1;
          lVar10 = uVar11 + 1;
          uVar11 = uVar13;
        } while (pnVar9->keys[lVar10] != name);
        bVar15 = uVar13 < uVar12;
      }
      pnVar9->seq = pnVar2->seq;
      unaff_R13 = pnVar9->values + uVar13;
    }
  } while (!bVar15);
  if (unaff_R13 == (nk_uint *)0x0) {
    unaff_R13 = nk_add_value(ctx,pnVar2,name,(nk_uint)pnVar9);
    *unaff_R13 = initial_state;
  }
  iVar6 = nk_strlen(local_80);
  header.x = 0.0;
  header.y = 0.0;
  header.w = 0.0;
  header.h = 0.0;
  ws = 0;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x487b,
                  "int nk_tree_element_image_push_hashed_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, int, enum nk_collapse_states *, int *)"
                 );
  }
  pnVar2 = ctx->current;
  local_88 = selected;
  if (pnVar2 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x487c,
                  "int nk_tree_element_image_push_hashed_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, int, enum nk_collapse_states *, int *)"
                 );
  }
  pnVar3 = pnVar2->layout;
  uVar5 = local_78._0_4_;
  if (pnVar3 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x487d,
                  "int nk_tree_element_image_push_hashed_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, int, enum nk_collapse_states *, int *)"
                 );
  }
  b = &pnVar2->buffer;
  local_98 = (ctx->style).window.spacing.x;
  local_94 = (ctx->style).window.spacing.y;
  local_90 = (ctx->style).selectable.padding.x;
  fVar16 = (ctx->style).tab.padding.y;
  fVar16 = fVar16 + fVar16 + ((ctx->style).font)->height;
  local_a0 = (nk_panel *)CONCAT44(local_a0._4_4_,fVar16);
  nk_layout_set_min_row_height(ctx,fVar16);
  nk_row_layout(ctx,NK_DYNAMIC,local_a0._0_4_,1,0);
  nk_layout_reset_min_row_height(ctx);
  nVar7 = nk_widget(&header,ctx);
  if (uVar5 == 1) {
    if ((ctx->style).tab.background.type == NK_STYLE_ITEM_IMAGE) {
      r.y = header.y;
      r.x = header.x;
      r.w = header.w;
      r.h = header.h;
      nk_draw_image(b,r,&(ctx->style).tab.background.data.image,(nk_color)0xffffffff);
    }
    else {
      rect.y = header.y;
      rect.x = header.x;
      rect.w = header.w;
      rect.h = header.h;
      nk_fill_rect(b,rect,0.0,(ctx->style).tab.border_color);
      fVar16 = (ctx->style).tab.border;
      fVar17 = fVar16 + fVar16;
      fVar18 = fVar17;
      if (fVar17 <= header.w) {
        fVar18 = header.w;
      }
      if (fVar17 <= header.h) {
        fVar17 = header.h;
      }
      rect_00.x = fVar16 + header.x;
      rect_00.w = fVar18 + fVar16 * -2.0;
      rect_00.y = header.y + fVar16;
      rect_00.h = fVar16 * -2.0 + fVar17;
      nk_fill_rect(b,rect_00,(ctx->style).tab.rounding,(ctx->style).tab.background.data.color);
    }
  }
  in = (nk_context *)0x0;
  if (nVar7 == NK_WIDGET_VALID && (pnVar3->flags & 0x1000) == 0) {
    in = ctx;
  }
  lVar10 = 0x1928;
  if (uVar5 == 1) {
    lVar10 = 0x17c8;
  }
  lVar14 = 0x19d8;
  if (uVar5 == 1) {
    lVar14 = 0x1878;
  }
  if (*unaff_R13 == 1) {
    lVar14 = lVar10;
  }
  pnVar4 = (ctx->style).font;
  fVar16 = pnVar4->height;
  fVar18 = header.y + (ctx->style).tab.padding.y;
  bounds.x = header.x + (ctx->style).tab.padding.x;
  local_78 = ZEXT416((uint)bounds.x);
  local_58 = ZEXT416((uint)fVar18);
  local_48 = ZEXT416((uint)fVar16);
  bounds.y = fVar18;
  bounds.h = fVar16;
  bounds.w = fVar16;
  local_a0 = pnVar3;
  iVar8 = nk_do_button_symbol(&ws,b,bounds,(&(ctx->style).tab.sym_minimize)[*unaff_R13 == 1],
                              NK_BUTTON_DEFAULT,
                              (nk_style_button *)
                              ((long)&(ctx->input).keyboard.keys[0].down + lVar14),&in->input,pnVar4
                             );
  str = local_80;
  if (iVar8 != 0) {
    *unaff_R13 = (uint)(*unaff_R13 != 1);
  }
  style = &(ctx->style).selectable;
  local_a4 = 0;
  iVar8 = nk_strlen(local_80);
  pnVar4 = (ctx->style).font;
  fVar18 = (*pnVar4->width)(pnVar4->userdata,pnVar4->height,str,iVar8);
  fVar18 = local_90 * 4.0 + fVar18;
  fVar16 = local_98 + (float)local_48._0_4_;
  if (local_98 + (float)local_48._0_4_ <= header.w) {
    fVar16 = header.w;
  }
  bounds_00.x = (float)local_78._0_4_ + (float)local_48._0_4_ + local_98;
  fVar17 = fVar16 - (local_94 + (float)local_48._0_4_ + (ctx->style).tab.indent);
  if (fVar18 <= fVar17) {
    fVar17 = fVar18;
  }
  pnVar4 = (ctx->style).font;
  header.w = fVar16;
  if (local_60 == (nk_image *)0x0) {
    bounds_01.y = (float)local_58._0_4_;
    bounds_01.x = bounds_00.x;
    bounds_01.h = pnVar4->height;
    bounds_01.w = fVar17;
    nk_do_selectable(&local_a4,b,bounds_01,str,iVar6,0x11,local_88,style,&in->input,pnVar4);
  }
  else {
    bounds_00.y = (float)local_58._0_4_;
    bounds_00.h = pnVar4->height;
    bounds_00.w = fVar17;
    nk_do_selectable_image
              (&local_a4,b,bounds_00,str,iVar6,0x11,local_88,local_60,style,&in->input,pnVar4);
  }
  iVar6 = 0;
  if (*unaff_R13 == 1) {
    fVar16 = (ctx->style).tab.indent;
    local_a0->at_x = (float)*local_a0->offset_x + header.x + fVar16;
    fVar18 = (local_a0->bounds).w;
    fVar17 = fVar16;
    if (fVar16 <= fVar18) {
      fVar17 = fVar18;
    }
    (local_a0->bounds).w = fVar17;
    (local_a0->bounds).w = fVar17 - (fVar16 + (ctx->style).window.padding.x);
    piVar1 = &(local_a0->row).tree_depth;
    *piVar1 = *piVar1 + 1;
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

NK_INTERN int
nk_tree_element_base(struct nk_context *ctx, enum nk_tree_type type,
    struct nk_image *img, const char *title, enum nk_collapse_states initial_state,
    int *selected, const char *hash, int len, int line)
{
    struct nk_window *win = ctx->current;
    int title_len = 0;
    nk_hash tree_hash = 0;
    nk_uint *state = 0;

    /* retrieve tree state from internal widget state tables */
    if (!hash) {
        title_len = (int)nk_strlen(title);
        tree_hash = nk_murmur_hash(title, (int)title_len, (nk_hash)line);
    } else tree_hash = nk_murmur_hash(hash, len, (nk_hash)line);
    state = nk_find_value(win, tree_hash);
    if (!state) {
        state = nk_add_value(ctx, win, tree_hash, 0);
        *state = initial_state;
    } return nk_tree_element_image_push_hashed_base(ctx, type, img, title,
        nk_strlen(title), (enum nk_collapse_states*)state, selected);
}